

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void libyuv::YuvPixel10(uint16_t y,uint16_t u,uint16_t v,uint8_t *b,uint8_t *g,uint8_t *r,
                       YuvConstants *yuvconstants)

{
  uint8_t uVar1;
  int iVar2;
  int g16;
  int b16;
  int local_3c;
  int local_38;
  int local_34;
  
  YuvPixel16(y,u,v,&local_34,&local_38,&local_3c,yuvconstants);
  iVar2 = local_34 >> 6;
  if (local_34 >> 6 < 1) {
    iVar2 = 0;
  }
  uVar1 = (uint8_t)iVar2;
  if (0xfe < iVar2) {
    uVar1 = 0xff;
  }
  *b = uVar1;
  local_38 = local_38 >> 6;
  if (local_38 < 1) {
    local_38 = 0;
  }
  uVar1 = (uint8_t)local_38;
  if (0xfe < local_38) {
    uVar1 = 0xff;
  }
  *g = uVar1;
  local_3c = local_3c >> 6;
  if (local_3c < 1) {
    local_3c = 0;
  }
  uVar1 = (uint8_t)local_3c;
  if (0xfe < local_3c) {
    uVar1 = 0xff;
  }
  *r = uVar1;
  return;
}

Assistant:

static __inline void YuvPixel10(uint16_t y,
                                uint16_t u,
                                uint16_t v,
                                uint8_t* b,
                                uint8_t* g,
                                uint8_t* r,
                                const struct YuvConstants* yuvconstants) {
  int b16;
  int g16;
  int r16;
  YuvPixel16(y, u, v, &b16, &g16, &r16, yuvconstants);
  *b = Clamp(b16 >> 6);
  *g = Clamp(g16 >> 6);
  *r = Clamp(r16 >> 6);
}